

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O0

ggml_backend_graph_plan_t
ggml_backend_cpu_graph_plan_create(ggml_backend_t backend,ggml_cgraph *cgraph)

{
  void *pvVar1;
  void *in_RSI;
  long in_RDI;
  ggml_backend_plan_cpu *cpu_plan;
  ggml_backend_cpu_context *cpu_ctx;
  ggml_threadpool *in_stack_000000b0;
  int in_stack_000000bc;
  ggml_cgraph *in_stack_000000c0;
  undefined1 local_58 [48];
  ulong *local_28;
  long local_20;
  void *local_18;
  
  local_20 = *(long *)(in_RDI + 0x78);
  local_18 = in_RSI;
  local_28 = (ulong *)operator_new(0x80);
  ggml_graph_plan(in_stack_000000c0,in_stack_000000bc,in_stack_000000b0);
  memcpy(local_28,local_58,0x30);
  memcpy(local_28 + 6,local_18,0x50);
  if (*local_28 != 0) {
    pvVar1 = operator_new__(*local_28);
    local_28[1] = (ulong)pvVar1;
    if (local_28[1] == 0) {
      if (local_28 != (ulong *)0x0) {
        operator_delete(local_28,0x80);
      }
      return (ggml_backend_graph_plan_t)0x0;
    }
  }
  local_28[4] = *(ulong *)(local_20 + 0x20);
  local_28[5] = *(ulong *)(local_20 + 0x28);
  return local_28;
}

Assistant:

static ggml_backend_graph_plan_t ggml_backend_cpu_graph_plan_create(ggml_backend_t backend, const struct ggml_cgraph * cgraph) {
    struct ggml_backend_cpu_context * cpu_ctx = (struct ggml_backend_cpu_context *)backend->context;

    struct ggml_backend_plan_cpu * cpu_plan = new ggml_backend_plan_cpu;

    cpu_plan->cplan = ggml_graph_plan(cgraph, cpu_ctx->n_threads, cpu_ctx->threadpool);
    cpu_plan->cgraph = *cgraph; // FIXME: deep copy

    if (cpu_plan->cplan.work_size > 0) {
        cpu_plan->cplan.work_data = new uint8_t[cpu_plan->cplan.work_size];
        if (cpu_plan->cplan.work_data == NULL) {
            delete cpu_plan;
            return NULL;
        }
    }

    cpu_plan->cplan.abort_callback      = cpu_ctx->abort_callback;
    cpu_plan->cplan.abort_callback_data = cpu_ctx->abort_callback_data;

    return cpu_plan;
}